

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdatetimeparser.cpp
# Opt level: O0

bool __thiscall
QDateTimeParser::skipToNextSection
          (QDateTimeParser *this,int index,QDateTime *current,QStringView text)

{
  long lVar1;
  bool bVar2;
  TimeSpec TVar3;
  int iVar4;
  SectionNode *pSVar5;
  QDateTimeParser *in_RCX;
  Data *in_RDI;
  long in_FS_OFFSET;
  int in_stack_00000040;
  int in_stack_00000044;
  QDateTime *in_stack_00000048;
  QDateTimeParser *in_stack_00000050;
  int pos;
  int max;
  int min;
  SectionNode *node;
  QStringView in_stack_000000a0;
  QDateTime tmp;
  QDateTime minimum;
  QDateTime maximum;
  QDateTime *in_stack_00000110;
  int in_stack_00000118;
  QDateTime *in_stack_ffffffffffffff18;
  undefined4 in_stack_ffffffffffffff20;
  undefined4 in_stack_ffffffffffffff24;
  undefined8 in_stack_ffffffffffffff38;
  undefined4 in_stack_ffffffffffffff40;
  undefined2 in_stack_ffffffffffffff44;
  undefined1 in_stack_ffffffffffffff46;
  undefined1 in_stack_ffffffffffffff47;
  undefined8 in_stack_ffffffffffffff50;
  undefined7 in_stack_ffffffffffffff58;
  undefined1 in_stack_ffffffffffffff5f;
  int in_stack_ffffffffffffff74;
  QDateTimeParser *in_stack_ffffffffffffff78;
  undefined8 in_stack_ffffffffffffffa8;
  int index_00;
  QDateTime *in_stack_ffffffffffffffb0;
  QDateTimeParser *in_stack_ffffffffffffffb8;
  undefined1 local_38 [8];
  undefined1 *local_30;
  undefined1 local_28 [4];
  int in_stack_ffffffffffffffdc;
  undefined1 *in_stack_ffffffffffffffe0;
  
  iVar4 = (int)((ulong)in_stack_ffffffffffffff50 >> 0x20);
  index_00 = (int)((ulong)in_stack_ffffffffffffffa8 >> 0x20);
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  pSVar5 = sectionNode((QDateTimeParser *)
                       CONCAT17(in_stack_ffffffffffffff47,
                                CONCAT16(in_stack_ffffffffffffff46,
                                         CONCAT24(in_stack_ffffffffffffff44,
                                                  in_stack_ffffffffffffff40))),
                       (int)((ulong)in_stack_ffffffffffffff38 >> 0x20));
  absoluteMin((QDateTimeParser *)CONCAT17(in_stack_ffffffffffffff5f,in_stack_ffffffffffffff58),iVar4
             );
  absoluteMax(in_stack_ffffffffffffff78,in_stack_ffffffffffffff74,(QDateTime *)&in_RDI->data);
  if ((pSVar5->type != TimeZoneSection) ||
     (TVar3 = QDateTime::timeSpec((QDateTime *)0x76ed60), TVar3 == OffsetFromUTC)) {
    in_stack_ffffffffffffffe0 = &DAT_aaaaaaaaaaaaaaaa;
    QDateTime::timeRepresentation(in_stack_ffffffffffffff18);
    (**(code **)(in_RDI->d + 1))(&stack0xffffffffffffffe0,in_RDI,local_28);
    QTimeZone::~QTimeZone((QTimeZone *)0x76edbc);
    local_30 = &DAT_aaaaaaaaaaaaaaaa;
    QDateTime::timeRepresentation(in_stack_ffffffffffffff18);
    (*(code *)(in_RDI->d->m_timeZone).d)(&local_30,in_RDI,local_38);
    QTimeZone::~QTimeZone((QTimeZone *)0x76ee0f);
    QDateTime::QDateTime
              ((QDateTime *)CONCAT44(in_stack_ffffffffffffff24,in_stack_ffffffffffffff20),
               in_stack_ffffffffffffff18);
    bVar2 = setDigit(in_stack_00000050,in_stack_00000048,in_stack_00000044,in_stack_00000040);
    if ((!bVar2) ||
       (bVar2 = ::operator<((QDateTime *)
                            CONCAT44(in_stack_ffffffffffffff24,in_stack_ffffffffffffff20),
                            in_stack_ffffffffffffff18), bVar2)) {
      getDigit(in_stack_ffffffffffffffb8,in_stack_ffffffffffffffb0,index_00);
    }
    bVar2 = setDigit(in_stack_00000050,in_stack_00000048,in_stack_00000044,in_stack_00000040);
    if ((!bVar2) ||
       (bVar2 = operator>((QDateTime *)CONCAT44(in_stack_ffffffffffffff24,in_stack_ffffffffffffff20)
                          ,in_stack_ffffffffffffff18), bVar2)) {
      getDigit(in_stack_ffffffffffffffb8,in_stack_ffffffffffffffb0,index_00);
    }
    QDateTime::~QDateTime((QDateTime *)0x76efcc);
    QDateTime::~QDateTime((QDateTime *)0x76efd9);
    QDateTime::~QDateTime((QDateTime *)0x76efe6);
  }
  iVar4 = (**(code **)((long)in_RDI->d + 0x28))();
  if (-1 < iVar4 - pSVar5->pos) {
    QStringView::size((QStringView *)&stack0xffffffffffffffe8);
  }
  bVar2 = potentialValue(in_RCX,in_stack_000000a0,(int)((ulong)in_stack_ffffffffffffffe0 >> 0x20),
                         (int)in_stack_ffffffffffffffe0,in_stack_ffffffffffffffdc,in_stack_00000110,
                         in_stack_00000118);
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return !bVar2;
}

Assistant:

bool QDateTimeParser::skipToNextSection(int index, const QDateTime &current, QStringView text) const
{
    Q_ASSERT(text.size() < sectionMaxSize(index));
    const SectionNode &node = sectionNode(index);
    int min = absoluteMin(index);
    int max = absoluteMax(index, current);
    // Time-zone field is only numeric if given as offset from UTC:
    if (node.type != TimeZoneSection || current.timeSpec() == Qt::OffsetFromUTC) {
        const QDateTime maximum = getMaximum(current.timeRepresentation());
        const QDateTime minimum = getMinimum(current.timeRepresentation());
        // Range from minimum to maximum might not contain current if an earlier
        // field's value was full-width but out of range. In such a case the
        // parse is already headed for Invalid, so it doesn't matter that we get
        // the wrong range of values for the current field here.

        QDateTime tmp = current;
        if (!setDigit(tmp, index, min) || tmp < minimum)
            min = getDigit(minimum, index);

        if (!setDigit(tmp, index, max) || tmp > maximum)
            max = getDigit(maximum, index);
    }
    int pos = cursorPosition() - node.pos;
    if (pos < 0 || pos >= text.size())
        pos = -1;

    /*
      If the value potentially can become another valid entry we don't want to
      skip to the next. E.g. In a M field (month without leading 0) if you type
      1 we don't want to autoskip (there might be [012] following) but if you
      type 3 we do.
    */
    return !potentialValue(text, min, max, index, current, pos);
}